

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd_bmp.c
# Opt level: O1

gdImagePtr gdImageCreateFromBmpCtx(gdIOCtxPtr infile)

{
  short sVar1;
  ushort uVar2;
  int iVar3;
  bmp_info_t *header;
  bmp_info_t *info;
  gdImagePtr im;
  char useless_bytes [24];
  int *local_58;
  int *local_50;
  undefined1 local_48 [24];
  
  header = (bmp_info_t *)gdCalloc(1,0x10);
  if (header == (bmp_info_t *)0x0) {
    return (gdImagePtr)0x0;
  }
  iVar3 = gdGetWordLSB((short *)header,infile);
  if ((((iVar3 == 0) || (iVar3 = gdGetIntLSB(&header->len,infile), iVar3 == 0)) ||
      (iVar3 = gdGetWordLSB((short *)&header->width,infile), iVar3 == 0)) ||
     (((iVar3 = gdGetWordLSB((short *)((long)&header->width + 2),infile), iVar3 == 0 ||
       (iVar3 = gdGetIntLSB(&header->height,infile), iVar3 == 0)) ||
      ((header->type != 0x4d42 || (info = (bmp_info_t *)gdCalloc(1,0x30), info == (bmp_info_t *)0x0)
       ))))) goto LAB_0011484f;
  iVar3 = gdGetIntLSB(&info->len,infile);
  if (iVar3 != 0) {
    iVar3 = info->len;
    if (iVar3 < 0x40) {
      if (iVar3 == 0xc) {
        iVar3 = gdGetWordLSB((short *)&info->width,infile);
        if (iVar3 != 0) {
          iVar3 = gdGetWordLSB((short *)&info->height,infile);
          if (iVar3 != 0) {
            iVar3 = gdGetWordLSB(&info->numplanes,infile);
            if ((iVar3 != 0) && (iVar3 = gdGetWordLSB(&info->depth,infile), iVar3 != 0)) {
              info->topdown = '\0';
              sVar1 = info->depth;
              info->numcolors = 1 << ((byte)sVar1 & 0x1f);
              info->type = 1;
              if ((0 < info->width) &&
                 ((((0 < info->height && (0 < info->numplanes)) && (0 < sVar1)) && (sVar1 != 0x1f)))
                 ) goto LAB_00114b0b;
            }
          }
        }
      }
      else if (iVar3 == 0x28) goto LAB_0011487b;
    }
    else if (iVar3 == 0x40) {
      iVar3 = gdGetIntLSB(&info->width,infile);
      if ((((((iVar3 != 0) && (iVar3 = gdGetIntLSB(&info->height,infile), iVar3 != 0)) &&
            ((iVar3 = gdGetWordLSB(&info->numplanes,infile), iVar3 != 0 &&
             ((iVar3 = gdGetWordLSB(&info->depth,infile), iVar3 != 0 &&
              (iVar3 = gdGetIntLSB(&info->enctype,infile), iVar3 != 0)))))) &&
           (iVar3 = gdGetIntLSB(&info->size,infile), iVar3 != 0)) &&
          (((iVar3 = gdGetIntLSB(&info->hres,infile), iVar3 != 0 &&
            (iVar3 = gdGetIntLSB(&info->vres,infile), iVar3 != 0)) &&
           (iVar3 = gdGetIntLSB(&info->numcolors,infile), iVar3 != 0)))) &&
         (iVar3 = gdGetIntLSB(&info->mincolors,infile), iVar3 != 0)) {
        iVar3 = gdGetBuf(local_48,0x18,infile);
LAB_00114950:
        local_50 = &info->numcolors;
        local_58 = &info->mincolors;
        if (iVar3 != 0) {
          if (info->height < 0) {
            info->topdown = '\x01';
            info->height = -info->height;
          }
          else {
            info->topdown = '\0';
          }
          info->type = 2;
          if (((0 < info->width) && (0 < info->height)) &&
             ((0 < info->numplanes && (((0 < info->depth && (-1 < *local_50)) && (-1 < *local_58))))
             )) {
LAB_00114b0b:
            if (info->depth < 0x10) {
              im = gdImageCreate(info->width,info->height);
            }
            else {
              im = gdImageCreateTrueColor(info->width,info->height);
            }
            if (im != (gdImagePtr)0x0) {
              uVar2 = info->depth;
              iVar3 = 1;
              if (uVar2 < 0x10) {
                if (uVar2 == 1) {
                  iVar3 = bmp_read_1bit(im,infile,info,(bmp_hdr_t *)header);
                }
                else if (uVar2 == 4) {
                  iVar3 = bmp_read_4bit(im,infile,info,(bmp_hdr_t *)header);
                }
                else if (uVar2 == 8) {
                  iVar3 = bmp_read_8bit(im,infile,info,(bmp_hdr_t *)header);
                }
              }
              else if (((uVar2 == 0x10) || (uVar2 == 0x18)) || (uVar2 == 0x20)) {
                iVar3 = bmp_read_direct(im,infile,info,(bmp_hdr_t *)header);
              }
              gdFree(header);
              gdFree(info);
              if (iVar3 != 0) {
                gdImageDestroy(im);
                return (gdImagePtr)0x0;
              }
              return im;
            }
          }
        }
      }
    }
    else if ((iVar3 == 0x7c) || (iVar3 == 0x6c)) {
LAB_0011487b:
      iVar3 = gdGetIntLSB(&info->width,infile);
      if (((iVar3 != 0) &&
          ((iVar3 = gdGetIntLSB(&info->height,infile), iVar3 != 0 &&
           (iVar3 = gdGetWordLSB(&info->numplanes,infile), iVar3 != 0)))) &&
         ((iVar3 = gdGetWordLSB(&info->depth,infile), iVar3 != 0 &&
          ((((iVar3 = gdGetIntLSB(&info->enctype,infile), iVar3 != 0 &&
             (iVar3 = gdGetIntLSB(&info->size,infile), iVar3 != 0)) &&
            (iVar3 = gdGetIntLSB(&info->hres,infile), iVar3 != 0)) &&
           ((iVar3 = gdGetIntLSB(&info->vres,infile), iVar3 != 0 &&
            (iVar3 = gdGetIntLSB(&info->numcolors,infile), iVar3 != 0)))))))) {
        iVar3 = gdGetIntLSB(&info->mincolors,infile);
        goto LAB_00114950;
      }
    }
  }
  gdFree(header);
  header = info;
LAB_0011484f:
  gdFree(header);
  return (gdImagePtr)0x0;
}

Assistant:

BGD_DECLARE(gdImagePtr) gdImageCreateFromBmpCtx(gdIOCtxPtr infile)
{
	bmp_hdr_t *hdr;
	bmp_info_t *info;
	gdImagePtr im = NULL;
	int error = 0;

	if (!(hdr= (bmp_hdr_t *)gdCalloc(1, sizeof(bmp_hdr_t)))) {
		return NULL;
	}

	if (bmp_read_header(infile, hdr)) {
		gdFree(hdr);
		return NULL;
	}

	if (hdr->magic != 0x4d42) {
		gdFree(hdr);
		return NULL;
	}

	if (!(info = (bmp_info_t *)gdCalloc(1, sizeof(bmp_info_t)))) {
		gdFree(hdr);
		return NULL;
	}

	if (bmp_read_info(infile, info)) {
		gdFree(hdr);
		gdFree(info);
		return NULL;
	}

	BMP_DEBUG(printf("Numcolours: %d\n", info->numcolors));
	BMP_DEBUG(printf("Width: %d\n", info->width));
	BMP_DEBUG(printf("Height: %d\n", info->height));
	BMP_DEBUG(printf("Planes: %d\n", info->numplanes));
	BMP_DEBUG(printf("Depth: %d\n", info->depth));
	BMP_DEBUG(printf("Offset: %d\n", hdr->off));

	if (info->depth >= 16) {
		im = gdImageCreateTrueColor(info->width, info->height);
	} else {
		im = gdImageCreate(info->width, info->height);
	}

	if (!im) {
		gdFree(hdr);
		gdFree(info);
		return NULL;
	}

	switch (info->depth) {
	case 1:
		BMP_DEBUG(printf("1-bit image\n"));
		error = bmp_read_1bit(im, infile, info, hdr);
		break;
	case 4:
		BMP_DEBUG(printf("4-bit image\n"));
		error = bmp_read_4bit(im, infile, info, hdr);
		break;
	case 8:
		BMP_DEBUG(printf("8-bit image\n"));
		error = bmp_read_8bit(im, infile, info, hdr);
		break;
	case 16:
	case 24:
	case 32:
		BMP_DEBUG(printf("Direct BMP image\n"));
		error = bmp_read_direct(im, infile, info, hdr);
		break;
	default:
		BMP_DEBUG(printf("Unknown bit count\n"));
		error = 1;
	}

	gdFree(hdr);
	gdFree(info);

	if (error) {
		gdImageDestroy(im);
		return NULL;
	}

	return im;
}